

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O3

void __thiscall Board::Board(Board *this,string *title,string *subtitle)

{
  pointer pcVar1;
  
  (this->board_title)._M_dataplus._M_p = (pointer)&(this->board_title).field_2;
  pcVar1 = (title->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + title->_M_string_length);
  (this->board_subtitle)._M_dataplus._M_p = (pointer)&(this->board_subtitle).field_2;
  pcVar1 = (subtitle->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->board_subtitle,pcVar1,pcVar1 + subtitle->_M_string_length);
  return;
}

Assistant:

Board(std::string title = "", std::string subtitle = "") :
      board_title{title}, board_subtitle{subtitle} {}